

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void Abc_NtkDumpOneCexSpecial(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  int iVar1;
  Aig_Man_t *p;
  Abc_Cex_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Abc_Cex_t *local_38;
  
  p = Abc_NtkToDar(pNtk,0,1);
  pAVar2 = Bmc_CexCareMinimize(p,p->nTruePis,pCex,4,0,0);
  local_38 = pAVar2;
  Aig_ManStop(p);
  if (pAVar2 != (Abc_Cex_t *)0x0) {
    for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkBox(pNtk,iVar6);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
        iVar1 = Abc_LatchIsInit0(pAVar3);
        fprintf((FILE *)pFile,"CEX: %s@0=%c\n",pcVar4,(ulong)(0x31 - iVar1));
      }
    }
    for (uVar7 = 0; (int)uVar7 <= pCex->iFrame; uVar7 = uVar7 + 1) {
      for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
        pAVar3 = Abc_NtkPi(pNtk,iVar6);
        uVar5 = pAVar2->nPis * uVar7 + pAVar2->nRegs + iVar6;
        if (((uint)(&pAVar2[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
          pcVar4 = Abc_ObjName(pAVar3);
          uVar5 = pCex->nPis * uVar7 + pCex->nRegs + iVar6;
          fprintf((FILE *)pFile,"CEX: %s@%d=%c\n",pcVar4,(ulong)uVar7,
                  (ulong)((((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) +
                         0x30));
        }
      }
    }
    Abc_CexFreeP(&local_38);
    return;
  }
  puts("Counter-example minimization has failed.");
  return;
}

Assistant:

void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pCare = NULL; int i, f; Abc_Obj_t * pObj;
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
    //fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
    //fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
    pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, 0, 0 );
    Aig_ManStop( pAig );
    if( pCare == NULL )   
    {
        printf( "Counter-example minimization has failed.\n" ); 
        return;
    }
    // output flop values (unaffected by the minimization)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "CEX: %s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
    // output PI values (while skipping the minimized ones)
    for ( f = 0; f <= pCex->iFrame; f++ )
        Abc_NtkForEachPi( pNtk, pObj, i )
            if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                fprintf( pFile, "CEX: %s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
    Abc_CexFreeP( &pCare );
}